

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeColumns(ImGuiOldColumns *columns)

{
  float offset_norm;
  int iVar1;
  ImGuiOldColumnData *pIVar2;
  ImGuiOldColumnData *pIVar3;
  bool bVar4;
  long lVar5;
  float fVar6;
  
  bVar4 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (void *)(ulong)columns->ID,(ulong)(uint)columns->Count,
                   (ulong)(uint)columns->Flags);
  if (bVar4) {
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",(double)(columns->OffMaxX - columns->OffMinX),
               (double)columns->OffMinX,(double)columns->OffMaxX);
    pIVar2 = (columns->Columns).Data;
    iVar1 = (columns->Columns).Size;
    for (lVar5 = 0; (long)iVar1 * 0x1c - lVar5 != 0; lVar5 = lVar5 + 0x1c) {
      pIVar3 = (columns->Columns).Data;
      offset_norm = *(float *)((long)&pIVar2->OffsetNorm + lVar5);
      fVar6 = GetColumnOffsetFromNorm(columns,offset_norm);
      BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)offset_norm,(double)fVar6,
                 ((long)pIVar2 + (lVar5 - (long)pIVar3)) / 0x1c & 0xffffffff);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeColumns(ImGuiOldColumns* columns)
{
    if (!TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
        return;
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
    for (ImGuiOldColumnData& column : columns->Columns)
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", (int)columns->Columns.index_from_ptr(&column), column.OffsetNorm, GetColumnOffsetFromNorm(columns, column.OffsetNorm));
    TreePop();
}